

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O3

double __thiscall CMU462::Matrix4x4::det(Matrix4x4 *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  dVar1 = this->entries[3].x;
  dVar2 = this->entries[2].y;
  dVar3 = this->entries[1].z;
  dVar4 = this->entries[2].x;
  dVar5 = this->entries[3].y;
  dVar6 = this->entries[2].z;
  dVar7 = this->entries[0].x;
  dVar8 = this->entries[0].y;
  dVar9 = this->entries[3].z;
  dVar10 = this->entries[0].w;
  dVar11 = this->entries[1].y;
  dVar12 = this->entries[1].x;
  dVar13 = this->entries[0].z;
  dVar14 = this->entries[1].w;
  dVar15 = this->entries[2].w;
  dVar16 = this->entries[3].w;
  return dVar11 * dVar7 * dVar6 * dVar16 +
         (((dVar4 * dVar8 * dVar3 * dVar16 +
           dVar2 * dVar12 * dVar13 * dVar16 +
           (((dVar9 * dVar12 * dVar8 * dVar15 +
             dVar5 * dVar7 * dVar3 * dVar15 +
             (((dVar1 * dVar11 * dVar13 * dVar15 +
               dVar9 * dVar2 * dVar7 * dVar14 +
               (((dVar6 * dVar1 * dVar8 * dVar14 +
                 dVar4 * dVar5 * dVar13 * dVar14 +
                 (((dVar4 * dVar11 * dVar9 * dVar10 +
                   dVar6 * dVar5 * dVar12 * dVar10 +
                   ((dVar1 * dVar2 * dVar3 * dVar10 - dVar3 * dVar4 * dVar5 * dVar10) -
                   dVar1 * dVar11 * dVar6 * dVar10)) - dVar2 * dVar12 * dVar9 * dVar10) -
                 dVar1 * dVar2 * dVar13 * dVar14)) - dVar6 * dVar5 * dVar7 * dVar14) -
               dVar9 * dVar4 * dVar8 * dVar14)) - dVar5 * dVar12 * dVar13 * dVar15) -
             dVar1 * dVar8 * dVar3 * dVar15)) - dVar9 * dVar11 * dVar7 * dVar15) -
           dVar4 * dVar11 * dVar13 * dVar16)) - dVar2 * dVar7 * dVar3 * dVar16) -
         dVar12 * dVar8 * dVar6 * dVar16);
}

Assistant:

double Matrix4x4::det( void ) const {
    const Matrix4x4& A( *this );

	return
	  A(0,3)*A(1,2)*A(2,1)*A(3,0) - A(0,2)*A(1,3)*A(2,1)*A(3,0) -
	  A(0,3)*A(1,1)*A(2,2)*A(3,0) + A(0,1)*A(1,3)*A(2,2)*A(3,0) +
	  A(0,2)*A(1,1)*A(2,3)*A(3,0) - A(0,1)*A(1,2)*A(2,3)*A(3,0) -
	  A(0,3)*A(1,2)*A(2,0)*A(3,1) + A(0,2)*A(1,3)*A(2,0)*A(3,1) +
	  A(0,3)*A(1,0)*A(2,2)*A(3,1) - A(0,0)*A(1,3)*A(2,2)*A(3,1) -
	  A(0,2)*A(1,0)*A(2,3)*A(3,1) + A(0,0)*A(1,2)*A(2,3)*A(3,1) +
	  A(0,3)*A(1,1)*A(2,0)*A(3,2) - A(0,1)*A(1,3)*A(2,0)*A(3,2) -
	  A(0,3)*A(1,0)*A(2,1)*A(3,2) + A(0,0)*A(1,3)*A(2,1)*A(3,2) +
	  A(0,1)*A(1,0)*A(2,3)*A(3,2) - A(0,0)*A(1,1)*A(2,3)*A(3,2) -
	  A(0,2)*A(1,1)*A(2,0)*A(3,3) + A(0,1)*A(1,2)*A(2,0)*A(3,3) +
	  A(0,2)*A(1,0)*A(2,1)*A(3,3) - A(0,0)*A(1,2)*A(2,1)*A(3,3) -
	  A(0,1)*A(1,0)*A(2,2)*A(3,3) + A(0,0)*A(1,1)*A(2,2)*A(3,3);

  }